

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.c
# Opt level: O0

uint32 cnt_twig(dtree_node_t *node)

{
  uint32 uVar1;
  uint32 uVar2;
  dtree_node_t *node_local;
  
  if ((node->y == (dtree_node_str *)0x0) && (node->n == (dtree_node_str *)0x0)) {
    node_local._4_4_ = 0;
  }
  else if ((node->y->y == (dtree_node_str *)0x0) &&
          (((node->y->n == (dtree_node_str *)0x0 && (node->n->y == (dtree_node_str *)0x0)) &&
           (node->n->n == (dtree_node_str *)0x0)))) {
    node_local._4_4_ = 1;
  }
  else if (((node->y->y == (dtree_node_str *)0x0) && (node->y->n == (dtree_node_str *)0x0)) &&
          ((node->n->y != (dtree_node_str *)0x0 || (node->n->n != (dtree_node_str *)0x0)))) {
    node_local._4_4_ = cnt_twig(node->n);
  }
  else if (((node->y->y == (dtree_node_str *)0x0) && (node->y->n == (dtree_node_str *)0x0)) ||
          ((node->n->y != (dtree_node_str *)0x0 || (node->n->n != (dtree_node_str *)0x0)))) {
    uVar1 = cnt_twig(node->y);
    uVar2 = cnt_twig(node->n);
    node_local._4_4_ = uVar1 + uVar2;
  }
  else {
    node_local._4_4_ = cnt_twig(node->y);
  }
  return node_local._4_4_;
}

Assistant:

uint32
cnt_twig(dtree_node_t *node)
{
    if (IS_LEAF(node)) {
	return 0;
    } else if (IS_LEAF(node->y) && IS_LEAF(node->n)) {
	return 1;
    }
    else {
	if (IS_LEAF(node->y) && !IS_LEAF(node->n)) {
	    return cnt_twig(node->n);
	}
	else if (!IS_LEAF(node->y) && IS_LEAF(node->n)) {
	    return cnt_twig(node->y);
	}
	else 
	    return cnt_twig(node->y) + cnt_twig(node->n);
    }
}